

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QSize __thiscall QMainWindowLayoutState::sizeHint(QMainWindowLayoutState *this)

{
  long in_FS_OFFSET;
  QSize result;
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.wd.m_i = 0;
  local_20.ht.m_i = 0;
  local_20 = QDockAreaLayout::sizeHint(&this->dockAreaLayout);
  local_20 = QToolBarAreaLayout::sizeHint(&this->toolBarAreaLayout,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

QSize QMainWindowLayoutState::sizeHint() const
{

    QSize result(0, 0);

#if QT_CONFIG(dockwidget)
    result = dockAreaLayout.sizeHint();
#else
    if (centralWidgetItem)
        result = centralWidgetItem->sizeHint();
#endif

#if QT_CONFIG(toolbar)
    result = toolBarAreaLayout.sizeHint(result);
#endif // QT_CONFIG(toolbar)

    return result;
}